

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O2

int search::negamax(int alpha,int beta,int depth,Board *pos,SearchInfo *info,PVTable *pvtable)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  int *piVar7;
  pointer pMVar8;
  int iVar9;
  Move move;
  vector<board::Move,_std::allocator<board::Move>_> moves;
  Move bestMove;
  Move local_98;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  SearchInfo *local_80;
  _Vector_base<board::Move,_std::allocator<board::Move>_> local_78;
  int (*local_60) [120];
  _Vector_base<board::Move,_std::allocator<board::Move>_> local_58;
  reverse_iterator<__gnu_cxx::__normal_iterator<board::Move_*,_std::vector<board::Move,_std::allocator<board::Move>_>_>_>
  local_40;
  reverse_iterator<__gnu_cxx::__normal_iterator<board::Move_*,_std::vector<board::Move,_std::allocator<board::Move>_>_>_>
  local_38;
  
  uVar6 = info->nodes;
  if ((uVar6 & 0x7ff) == 0) {
    checkup(info);
    uVar6 = info->nodes;
  }
  info->nodes = uVar6 + 1;
  bVar1 = isRepetition(pos);
  if ((pos->fiftyMove < 100 && !bVar1) || (iVar4 = 0, pos->ply < 1)) {
    piVar7 = &pos->side;
    if (pos->side == 0) {
      piVar7 = pos->board + 0x3c;
    }
    bVar1 = board::Board::sqAttacked(pos,(*(int (*) [10])(piVar7 + 0x86))[0],pos->side ^ 1);
    iVar3 = (uint)bVar1 + depth;
    if (iVar3 == 0) {
      iVar4 = board::evaluate::score(pos);
      if (alpha < iVar4) {
        alpha = iVar4;
      }
      if (beta <= iVar4) {
        return beta;
      }
    }
    movegen::generateAll((MoveList *)&local_58,pos,iVar3 == 0);
    std::vector<board::Move,_std::allocator<board::Move>_>::vector
              ((vector<board::Move,_std::allocator<board::Move>_> *)&local_78,
               (vector<board::Move,_std::allocator<board::Move>_> *)&local_58);
    std::_Vector_base<board::Move,_std::allocator<board::Move>_>::~_Vector_base(&local_58);
    PVTable::getMove(pvtable,pos);
    local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_38.current._M_current =
         (__normal_iterator<board::Move_*,_std::vector<board::Move,_std::allocator<board::Move>_>_>)
         (__normal_iterator<board::Move_*,_std::vector<board::Move,_std::allocator<board::Move>_>_>)
         local_78._M_impl.super__Vector_impl_data._M_finish;
    local_40.current._M_current =
         (__normal_iterator<board::Move_*,_std::vector<board::Move,_std::allocator<board::Move>_>_>)
         (__normal_iterator<board::Move_*,_std::vector<board::Move,_std::allocator<board::Move>_>_>)
         local_78._M_impl.super__Vector_impl_data._M_start;
    local_80 = info;
    std::
    sort<std::reverse_iterator<__gnu_cxx::__normal_iterator<board::Move*,std::vector<board::Move,std::allocator<board::Move>>>>>
              (&local_38,&local_40);
    local_84 = -beta;
    local_88 = iVar3 + -1;
    iVar4 = 0;
    if (iVar3 < 1) {
      local_88 = 0;
    }
    local_60 = pos->searchHistory;
    local_90 = alpha;
    local_8c = beta;
    for (pMVar8 = local_78._M_impl.super__Vector_impl_data._M_start;
        pMVar8 != local_78._M_impl.super__Vector_impl_data._M_finish; pMVar8 = pMVar8 + 1) {
      local_98 = *pMVar8;
      bVar2 = board::makemove::move(&local_98,pos);
      if (bVar2) {
        iVar5 = negamax(local_84,-alpha,local_88,pos,local_80,pvtable);
        board::makemove::undo(pos);
        if (local_80->stopped != false) {
          iVar4 = 0;
          goto LAB_00105bb5;
        }
        iVar4 = iVar4 + 1;
        iVar9 = -iVar5;
        if (SBORROW4(alpha,iVar9) != alpha + iVar5 < 0) {
          if (local_8c <= iVar9) {
            iVar4 = local_8c;
            if ((0 < iVar3) && (((ulong)local_98 & 0x7c000) == 0)) {
              pos->searchKillers[1][pos->ply] = pos->searchKillers[0][pos->ply];
              pos->searchKillers[0][pos->ply] = local_98.value;
            }
            goto LAB_00105bb5;
          }
          local_58._M_impl.super__Vector_impl_data._M_start = (pointer)local_98;
          alpha = iVar9;
          if (((ulong)local_98 & 0x7c000) == 0 && 0 < iVar3) {
            piVar7 = (int *)((long)local_60[pos->board[local_98.value & 0x7f]] +
                            (ulong)((uint)((ulong)local_98 >> 5) & 0x1fc));
            *piVar7 = *piVar7 + iVar3;
          }
        }
      }
    }
    if (iVar4 == 0 && 0 < iVar3) {
      iVar4 = 0;
      if (bVar1) {
        iVar4 = pos->ply + -0x7ffffffe;
      }
    }
    else {
      iVar4 = local_90;
      if (alpha != local_90) {
        PVTable::addMove(pvtable,pos,(Move *)&local_58);
        iVar4 = alpha;
      }
    }
LAB_00105bb5:
    std::_Vector_base<board::Move,_std::allocator<board::Move>_>::~_Vector_base(&local_78);
  }
  return iVar4;
}

Assistant:

int search::negamax(int alpha, int beta, int depth, board::Board& pos, SearchInfo& info, PVTable& pvtable)
{
    if ((info.getNodes() & 2047) == 0) {
        checkup(info);
    }
    info.incrementNodes();
    if ((isRepetition(pos) || pos.getFiftyMove() >= 100) && pos.getPly() > 0) {
        return 0;
    }
    bool inCheck =
        pos.sqAttacked(pos.getPieceList(pos.getSide() == board::WHITE ? board::WK : board::BK)[0], pos.getSide() ^ 1);
    if (inCheck) {
        depth++;
    }
    if (depth == 0) {
        int score = board::evaluate::score(pos);
        if (score >= beta) {
            return beta;
        }
        if (score > alpha) {
            alpha = score;
        }
    }
    std::vector<board::Move> moves = movegen::generateAll(pos, depth == 0).getMoves();
    board::Move pvMove = pvtable.getMove(pos);
    if (pvMove.getValue() != 0) {
        for (board::Move move : moves) {
            if (pvMove.getValue() == move.getValue()) {
                move.addScore(2000000);
                break;
            }
        }
    }
    board::Move bestMove;
    int legal = 0;
    int oldAlpha = alpha;
    int score = NEG_INFINITY;
    std::sort(moves.rbegin(), moves.rend());
    for (board::Move move : moves) {
        if (!board::makemove::move(move, pos)) {
            continue;
        }
        legal++;
        score = -negamax(-beta, -alpha, depth > 0 ? depth - 1 : 0, pos, info, pvtable);
        board::makemove::undo(pos);
        if (info.getStopped()) {
            return 0;
        }
        if (score > alpha) {
            if (score >= beta) {
                if (depth > 0) {
                    if (!(move.getValue() & board::Move::MFLAGCAP)) {
                        pos.addSearchKiller(move.getValue());
                    }
                }
                return beta;
            }
            alpha = score;
            bestMove = move;
            if (depth > 0) {
                if (!(move.getValue() & board::Move::MFLAGCAP)) {
                    pos.incrementSearchHistory(board::Move::TOSQ(move.getValue()), board::Move::FROMSQ(move.getValue()),
                                               depth);
                }
            }
        }
    }
    if (depth > 0 && legal == 0) {
        if (inCheck) {
            return -POS_INFINITY + pos.getPly();
        }
        return 0;
    }
    if (alpha != oldAlpha) {
        pvtable.addMove(pos, bestMove);
    }
    return alpha;
}